

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testserverconnector.hpp
# Opt level: O3

void TestServerConnector::VerifyNotificationResult(string *raw_response)

{
  code *pcVar1;
  char extraout_AL;
  double __x;
  ResultBuilder DOCTEST_RB;
  ExpressionDecomposer local_d4;
  Result local_d0;
  ulong local_b0;
  ResultBuilder local_a8;
  
  doctest::String::String((String *)&local_d0,"");
  doctest::detail::ResultBuilder::ResultBuilder
            (&local_a8,DT_REQUIRE,
             "/workspace/llm4binary/github/license_c_cmakelists/jsonrpcx[P]json-rpc-cxx/test/testserverconnector.hpp"
             ,0x28,"raw_response.empty()","",(String *)&local_d0);
  doctest::String::~String((String *)&local_d0);
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_d4,DT_REQUIRE);
  local_b0 = (ulong)(raw_response->_M_string_length == 0) | (ulong)local_d4.m_at << 0x20;
  doctest::detail::Expression_lhs::operator_cast_to_Result(&local_d0,(Expression_lhs *)&local_b0);
  doctest::detail::ResultBuilder::setResult(&local_a8,&local_d0);
  doctest::String::~String(&local_d0.m_decomp);
  doctest::detail::ResultBuilder::log(&local_a8,__x);
  if (extraout_AL != '\0') {
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
  doctest::detail::ResultBuilder::react(&local_a8);
  doctest::String::~String((String *)&local_a8.super_AssertData.m_exception_string);
  doctest::String::~String(&local_a8.super_AssertData.m_decomp);
  doctest::String::~String(&local_a8.super_AssertData.m_exception);
  return;
}

Assistant:

static void VerifyNotificationResult(string &raw_response) { REQUIRE(raw_response.empty()); }